

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_manager.cc
# Opt level: O0

RC __thiscall PF_Manager::OpenFile(PF_Manager *this,char *fileName,PF_FileHandle *fileHandle)

{
  int iVar1;
  ssize_t sVar2;
  int numBytes;
  int rc;
  PF_FileHandle *fileHandle_local;
  char *fileName_local;
  PF_Manager *this_local;
  
  if (fileHandle->bFileOpen == 0) {
    iVar1 = open(fileName,2);
    fileHandle->unixfd = iVar1;
    if (iVar1 < 0) {
      this_local._4_4_ = -0xb;
    }
    else {
      sVar2 = read(fileHandle->unixfd,&fileHandle->hdr,8);
      if ((int)sVar2 == 8) {
        fileHandle->bHdrChanged = 0;
        fileHandle->pBufferMgr = this->pBufferMgr;
        fileHandle->bFileOpen = 1;
        this_local._4_4_ = 0;
      }
      else {
        this_local._4_4_ = -5;
        if ((int)sVar2 < 0) {
          this_local._4_4_ = -0xb;
        }
        close(fileHandle->unixfd);
        fileHandle->bFileOpen = 0;
      }
    }
  }
  else {
    this_local._4_4_ = 4;
  }
  return this_local._4_4_;
}

Assistant:

RC PF_Manager::OpenFile (const char *fileName, PF_FileHandle &fileHandle)
{
   int rc;                   // return code

   // Ensure file is not already open
   if (fileHandle.bFileOpen)
      return (PF_FILEOPEN);

   // Open the file
   if ((fileHandle.unixfd = open(fileName,
#ifdef PC
         O_BINARY |
#endif
         O_RDWR)) < 0)
      return (PF_UNIX);

   // Read the file header
   {
      int numBytes = read(fileHandle.unixfd, (char *)&fileHandle.hdr,
            sizeof(PF_FileHdr));
      if (numBytes != sizeof(PF_FileHdr)) {
         rc = (numBytes < 0) ? PF_UNIX : PF_HDRREAD;
         goto err;
      }
   }

   // Set file header to be not changed
   fileHandle.bHdrChanged = FALSE;

   // Set local variables in file handle object to refer to open file
   fileHandle.pBufferMgr = pBufferMgr;
   fileHandle.bFileOpen = TRUE;

   // Return ok
   return 0;

err:
   // Close file
   close(fileHandle.unixfd);
   fileHandle.bFileOpen = FALSE;

   // Return error
   return (rc);
}